

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

char * llvm::writeUnsignedDecimal(char *dst,uint n)

{
  bool bVar1;
  long lVar2;
  char cStack_29;
  char buff [40];
  
  lVar2 = 0;
  do {
    buff[lVar2] = (byte)((ulong)n % 10) | 0x30;
    lVar2 = lVar2 + 1;
    bVar1 = 9 < n;
    n = n / 10;
  } while (bVar1);
  do {
    *dst = buff[lVar2 + -1];
    dst = dst + 1;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return dst;
}

Assistant:

static char *
writeUnsignedDecimal (char *dst, unsigned int n)
{
  char buff[40], *p;

  p = buff;
  do
    *p++ = '0' + n % 10;
  while (n /= 10);

  do
    *dst++ = *--p;
  while (p != buff);

  return dst;
}